

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_window.cpp
# Opt level: O3

void __thiscall duckdb::LogicalWindow::ResolveTypes(LogicalWindow *this)

{
  vector<duckdb::LogicalType,_true> *this_00;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  pointer pLVar1;
  pointer pLVar2;
  pointer puVar3;
  reference pvVar4;
  pointer pLVar5;
  pointer pEVar6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer this_02;
  
  this_00 = &(this->super_LogicalOperator).types;
  pLVar1 = (this->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = &(this->super_LogicalOperator).children;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_01,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  pLVar2 = (pLVar5->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_01,0);
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar4);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_00,pLVar1,
             pLVar2,(pLVar5->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  puVar3 = (this->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->super_LogicalOperator).expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar3; this_02 = this_02 + 1
      ) {
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,
               &pEVar6->return_type);
  }
  return;
}

Assistant:

void LogicalWindow::ResolveTypes() {
	types.insert(types.end(), children[0]->types.begin(), children[0]->types.end());
	for (auto &expr : expressions) {
		types.push_back(expr->return_type);
	}
}